

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::PortDeclarationSyntax::PortDeclarationSyntax
          (PortDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,PortHeaderSyntax *header,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  DeclaratorSyntax *pDVar4;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  undefined8 uVar5;
  iterator __begin2;
  iterator_base<slang::syntax::DeclaratorSyntax_*> local_40;
  
  uVar5 = semi._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,PortDeclaration,attributes);
  (this->header).ptr = header;
  uVar3 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (declarators->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00679648;
  sVar1 = (declarators->elements)._M_extent._M_extent_value;
  (this->declarators).elements._M_ptr = (declarators->elements)._M_ptr;
  (this->declarators).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = (short)uVar5;
  (this->semi).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->semi).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->semi).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->semi).info = semi.info;
  (header->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_40.index = 0;
  sVar1 = (this->declarators).elements._M_extent._M_extent_value;
  local_40.list = &this->declarators;
  for (; (local_40.list != &this->declarators || (local_40.index != sVar1 + 1 >> 1));
      local_40.index = local_40.index + 1) {
    pDVar4 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::dereference(&local_40);
    (pDVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

PortDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, PortHeaderSyntax& header, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::PortDeclaration, attributes), header(&header), declarators(declarators), semi(semi) {
        this->header->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }